

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall protozero::Field::get(Field *this,string *val)

{
  string local_38;
  string *local_18;
  string *val_local;
  Field *this_local;
  
  local_18 = val;
  val_local = (string *)this;
  as_std_string_abi_cxx11_(&local_38,this);
  std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void get(std::string* val) const { *val = as_std_string(); }